

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to1.h
# Opt level: O0

void ncnn::deconvolution_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar10;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _w;
  __m512 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  float local_984;
  int local_830;
  int local_824;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined4 local_808;
  long local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  int local_7d4;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  long local_7b0;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined8 local_790;
  long local_788;
  undefined1 local_780 [64];
  float local_710;
  int local_70c;
  int local_708;
  int local_704;
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  int local_6f0;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  long local_6c0;
  int local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  ulong local_6a0;
  float *local_698;
  int local_68c;
  long local_688;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  long *local_660;
  long *local_658;
  long *local_650;
  undefined1 local_645;
  int local_644;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_618;
  undefined8 *local_608;
  undefined8 *local_5f8;
  undefined8 *local_5d8;
  undefined8 *local_5b8;
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 *local_538;
  undefined1 (*local_528) [64];
  undefined1 (*local_520) [64];
  undefined1 local_515;
  int local_514;
  undefined8 *local_508;
  undefined1 local_4e5;
  int local_4e4;
  undefined8 *local_4d8;
  int local_4b4;
  undefined8 *local_4b0;
  float local_4a4;
  float local_4a0;
  float local_49c;
  float local_498;
  float local_494;
  float local_490;
  float local_48c;
  float local_488;
  float local_484;
  long *local_480;
  int local_478;
  float local_474 [3];
  long *local_468;
  undefined8 local_460;
  long *local_458;
  undefined8 local_450;
  long *local_448;
  undefined8 local_440;
  long *local_438;
  undefined8 local_430;
  long *local_428;
  long local_420;
  undefined4 local_414;
  long local_410;
  long local_408;
  undefined4 local_3fc;
  int local_3f8;
  int local_3f4;
  undefined8 *local_3f0;
  long local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  long local_3d0;
  undefined4 local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  ulong local_3a0;
  float *local_398;
  undefined4 local_38c;
  int local_388;
  int local_384;
  undefined8 *local_380;
  undefined4 local_374;
  long local_370;
  undefined4 local_364;
  long local_360;
  undefined4 local_354;
  long local_350;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  ulong local_210;
  undefined8 uStack_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  undefined1 local_70 [16];
  ulong local_60;
  undefined8 uStack_58;
  
  local_674 = (int)in_RSI[7];
  local_678 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_67c = dilation_w * (in_R9D + -1) + 1;
  local_688 = *in_RCX;
  local_670 = in_R9D;
  local_66c = in_R8D;
  local_660 = in_RDX;
  local_658 = in_RSI;
  local_650 = in_RDI;
  for (local_68c = 0; local_68c < local_674; local_68c = local_68c + 1) {
    local_638 = &local_6e0;
    local_384 = *(int *)((long)local_658 + 0x2c);
    local_388 = (int)local_658[6];
    local_38c = *(undefined4 *)((long)local_658 + 0x34);
    local_698 = (float *)(*local_658 + local_658[8] * (long)local_68c * local_658[2]);
    local_3a0 = local_658[2];
    local_3a4 = (undefined4)local_658[3];
    local_3b0 = local_658[4];
    local_380 = &local_6e0;
    local_370 = (long)local_384 * (long)local_388 * local_3a0;
    local_6a0 = (local_370 + 0xfU & 0xfffffffffffffff0) / local_3a0;
    local_6b8 = (int)local_658[5] + -1;
    if ((int)local_658[5] == 4) {
      local_6a0 = (long)*(int *)((long)local_658 + 0x2c) * (long)(int)local_658[6];
    }
    local_5f8 = &local_6e0;
    local_628 = &local_6e0;
    local_374 = 0x10;
    local_644 = local_68c;
    local_645 = 1;
    local_6e0 = 0;
    local_6d0 = 0;
    local_6c8 = 0;
    local_6b4 = 0;
    local_6b0 = 0;
    local_6ac = 0;
    local_6a8 = 0;
    local_6d8 = 0;
    local_6f0 = local_66c * local_670;
    local_6f4 = *(int *)((long)local_650 + 0x2c);
    local_6f8 = (int)local_650[6];
    local_6fc = (int)local_650[7];
    local_700 = *(int *)((long)local_658 + 0x2c);
    local_704 = (int)local_658[6];
    local_398 = local_698;
    local_6c0 = local_3b0;
    for (local_708 = 0; local_708 < local_704; local_708 = local_708 + 1) {
      for (local_70c = 0; local_70c < local_700; local_70c = local_70c + 1) {
        local_710 = 0.0;
        if (local_688 != 0) {
          local_710 = *(float *)(local_688 + (long)local_68c * 4);
        }
        local_780 = ZEXT1664(ZEXT816(0));
        local_4d8 = &local_7d0;
        local_3f4 = *(int *)((long)local_660 + 0x2c);
        local_3f8 = (int)local_660[6];
        local_3fc = *(undefined4 *)((long)local_660 + 0x34);
        local_408 = *local_660 + local_660[8] * (long)local_68c * local_660[2];
        local_410 = local_660[2];
        local_414 = (undefined4)local_660[3];
        local_420 = local_660[4];
        local_3f0 = &local_7d0;
        local_350 = (long)local_3f4 * (long)local_3f8 * local_410;
        local_538 = &local_7d0;
        local_618 = &local_7d0;
        local_354 = 0x10;
        local_4e4 = local_68c;
        local_4e5 = 1;
        uStack_548 = 0;
        uStack_550 = 0;
        uStack_558 = 0;
        uStack_560 = 0;
        uStack_568 = 0;
        uStack_570 = 0;
        uStack_578 = 0;
        local_580 = 0;
        local_7d0 = 0;
        local_7c0 = 0;
        local_7b8 = 0;
        local_7a8 = 0;
        local_7a4 = 0;
        local_7a0 = 0;
        local_79c = 0;
        local_798 = 0;
        local_790 = 0;
        local_7c8 = 0;
        local_788 = local_408;
        for (local_7d4 = 0; local_7d4 < local_6fc; local_7d4 = local_7d4 + 1) {
          local_508 = &local_820;
          local_3bc = *(int *)((long)local_650 + 0x2c);
          local_3c0 = (int)local_650[6];
          local_3c4 = *(undefined4 *)((long)local_650 + 0x34);
          local_3d0 = *local_650 + local_650[8] * (long)local_7d4 * local_650[2];
          local_3d8 = local_650[2];
          local_3dc = (undefined4)local_650[3];
          local_3e8 = local_650[4];
          local_3b8 = &local_820;
          local_360 = (long)local_3bc * (long)local_3c0 * local_3d8;
          for (local_824 = 0; local_824 < local_670; local_824 = local_824 + 1) {
            iVar7 = (local_708 + local_824 * dilation_w) - (local_67c + -1);
            if (((-1 < iVar7) && (iVar7 % stride_w == 0)) &&
               (iVar7 = iVar7 / stride_w, iVar7 < local_6f8)) {
              for (local_830 = 0; local_830 < local_66c; local_830 = local_830 + 1) {
                iVar8 = (local_70c + local_830 * in_stack_00000008) - (local_678 + -1);
                if (((-1 < iVar8) && (iVar8 % dilation_h == 0)) && (iVar8 / dilation_h < local_6f4))
                {
                  local_4b0 = &local_820;
                  local_520 = (undefined1 (*) [64])
                              (local_3d0 + (long)local_3bc * (long)iVar7 * local_3d8 +
                              (long)(iVar8 / dilation_h << 4) * 4);
                  local_280 = *(undefined8 *)*local_520;
                  uStack_278 = *(undefined8 *)(*local_520 + 8);
                  uStack_270 = *(undefined8 *)(*local_520 + 0x10);
                  uStack_268 = *(undefined8 *)(*local_520 + 0x18);
                  uStack_260 = *(undefined8 *)(*local_520 + 0x20);
                  uStack_258 = *(undefined8 *)(*local_520 + 0x28);
                  uStack_250 = *(undefined8 *)(*local_520 + 0x30);
                  uStack_248 = *(undefined8 *)(*local_520 + 0x38);
                  local_528 = (undefined1 (*) [64])
                              (local_788 + (long)((local_824 * local_66c + local_830) * 0x10) * 4);
                  local_2c0 = *(undefined8 *)*local_528;
                  uStack_2b8 = *(undefined8 *)(*local_528 + 8);
                  uStack_2b0 = *(undefined8 *)(*local_528 + 0x10);
                  uStack_2a8 = *(undefined8 *)(*local_528 + 0x18);
                  uStack_2a0 = *(undefined8 *)(*local_528 + 0x20);
                  uStack_298 = *(undefined8 *)(*local_528 + 0x28);
                  uStack_290 = *(undefined8 *)(*local_528 + 0x30);
                  uStack_288 = *(undefined8 *)(*local_528 + 0x38);
                  local_300 = local_780._0_8_;
                  uStack_2f8 = local_780._8_8_;
                  uStack_2f0 = local_780._16_8_;
                  uStack_2e8 = local_780._24_8_;
                  uStack_2e0 = local_780._32_8_;
                  uStack_2d8 = local_780._40_8_;
                  uStack_2d0 = local_780._48_8_;
                  uStack_2c8 = local_780._56_8_;
                  local_780 = vfmadd213ps_avx512f(*local_528,*local_520,local_780);
                  local_4b4 = iVar7;
                }
              }
            }
          }
          local_788 = local_788 + (long)(local_6f0 << 4) * 4;
          local_608 = &local_820;
          local_364 = 0x10;
          local_514 = local_7d4;
          local_515 = 1;
          local_820 = 0;
          local_810 = 0;
          local_808 = 0;
          local_7f8 = 0;
          local_7f4 = 0;
          local_7f0 = 0;
          local_7ec = 0;
          local_7e8 = 0;
          local_7e0 = 0;
          local_818 = 0;
          local_5d8 = local_608;
          local_800 = local_3e8;
        }
        local_1c0 = local_780._0_8_;
        uStack_1b8 = local_780._8_8_;
        uStack_1b0 = local_780._16_8_;
        uStack_1a8 = local_780._24_8_;
        uStack_1a0 = local_780._32_8_;
        uStack_198 = local_780._40_8_;
        uStack_190 = local_780._48_8_;
        uStack_188 = local_780._56_8_;
        local_100 = local_780._0_8_;
        uStack_f8 = local_780._8_8_;
        uStack_f0 = local_780._16_8_;
        uStack_e8 = local_780._24_8_;
        uStack_e0 = local_780._32_8_;
        uStack_d8 = local_780._40_8_;
        uStack_d0 = local_780._48_8_;
        uStack_c8 = local_780._56_8_;
        local_160 = local_780._0_8_;
        uVar3 = local_160;
        uStack_158 = local_780._8_8_;
        uVar4 = uStack_158;
        uStack_150 = local_780._16_8_;
        uVar5 = uStack_150;
        uStack_148 = local_780._24_8_;
        uVar6 = uStack_148;
        local_5a0 = vextractf64x4_avx512f(local_780,1);
        local_160._0_4_ = local_780._0_4_;
        local_160._4_4_ = local_780._4_4_;
        uStack_158._0_4_ = local_780._8_4_;
        uStack_158._4_4_ = local_780._12_4_;
        uStack_150._0_4_ = local_780._16_4_;
        uStack_150._4_4_ = local_780._20_4_;
        uStack_148._0_4_ = local_780._24_4_;
        uStack_148._4_4_ = local_780._28_4_;
        local_1e0 = (float)local_160 + local_180;
        fStack_1dc = local_160._4_4_ + fStack_17c;
        fStack_1d8 = (float)uStack_158 + fStack_178;
        fStack_1d4 = uStack_158._4_4_ + fStack_174;
        fStack_1d0 = (float)uStack_150 + fStack_170;
        fStack_1cc = uStack_150._4_4_ + fStack_16c;
        fStack_1c8 = (float)uStack_148 + fStack_168;
        fStack_1c4 = uStack_148._4_4_ + fStack_164;
        local_c0 = CONCAT44(fStack_1dc,local_1e0);
        uStack_b8 = CONCAT44(fStack_1d4,fStack_1d8);
        uStack_b0 = CONCAT44(fStack_1cc,fStack_1d0);
        uStack_a8 = CONCAT44(fStack_1c4,fStack_1c8);
        uStack_108 = CONCAT44(fStack_1c4,fStack_1c8);
        local_110 = CONCAT44(fStack_1cc,fStack_1d0);
        local_1f0 = fStack_1d0 + local_120;
        fStack_1ec = fStack_1cc + fStack_11c;
        fStack_1e8 = fStack_1c8 + fStack_118;
        fStack_1e4 = fStack_1c4 + fStack_114;
        local_130 = CONCAT44(fStack_1ec,local_1f0);
        uStack_128 = CONCAT44(fStack_1e4,fStack_1e8);
        auVar2._8_8_ = uStack_128;
        auVar2._0_8_ = local_130;
        auVar1._8_8_ = uStack_128;
        auVar1._0_8_ = local_130;
        _local_140 = vunpckhpd_avx(auVar1,auVar2);
        local_200 = local_1f0 + (float)local_140._0_4_;
        fStack_1fc = fStack_1ec + (float)local_140._4_4_;
        fStack_1f8 = fStack_1e8 + fStack_138;
        fStack_1f4 = fStack_1e4 + fStack_134;
        local_70._0_4_ = local_200 + fStack_1fc;
        local_70._4_4_ = 0;
        local_210 = local_70._0_8_;
        uStack_208 = 0;
        local_60 = local_70._0_8_;
        uStack_58 = 0;
        local_984 = local_710 + (float)local_70._0_4_;
        local_480 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_478 = stride_h;
        local_474[0] = local_984;
        local_710 = local_984;
        local_5b8 = local_618;
        local_160 = uVar3;
        uStack_158 = uVar4;
        uStack_150 = uVar5;
        uStack_148 = uVar6;
        local_a0 = local_130;
        uStack_98 = uStack_128;
        local_90 = local_130;
        uStack_88 = uStack_128;
        local_80 = fStack_1fc;
        fStack_7c = fStack_1fc;
        fStack_78 = fStack_1fc;
        fStack_74 = fStack_1fc;
        local_70 = ZEXT416((uint)local_70._0_4_);
        local_7b0 = local_420;
        switch(stride_h) {
        case 1:
          auVar1 = vmaxss_avx(ZEXT416((uint)local_984),(undefined1  [16])0x0);
          local_474[0] = auVar1._0_4_;
          break;
        case 2:
          local_430 = 0;
          local_484 = *(float *)*local_480;
          if (local_984 <= 0.0) {
            local_984 = local_984 * local_484;
          }
          local_474[0] = local_984;
          local_428 = local_480;
          break;
        case 3:
          local_440 = 0;
          local_488 = *(float *)*local_480;
          local_450 = 1;
          local_48c = *(float *)(*local_480 + 4);
          if (local_984 < local_488) {
            local_474[0] = local_488;
          }
          local_448 = local_480;
          local_438 = local_480;
          if (local_48c < local_474[0]) {
            local_474[0] = local_48c;
          }
          break;
        case 4:
          local_490 = 88.37626;
          pfVar9 = std::min<float>(local_474,&local_490);
          local_474[0] = *pfVar9;
          local_494 = -88.37626;
          pfVar9 = std::max<float>(local_474,&local_494);
          local_474[0] = *pfVar9;
          fVar10 = expf(-local_474[0]);
          local_474[0] = 1.0 / (fVar10 + 1.0);
          break;
        case 5:
          fVar10 = expf(local_984);
          fVar10 = logf(fVar10 + 1.0);
          local_474[0] = tanhf(fVar10);
          local_474[0] = local_984 * local_474[0];
          break;
        case 6:
          local_460 = 0;
          local_498 = *(float *)*local_480;
          local_474[1] = 1.4013e-45;
          local_474[2] = 0.0;
          local_49c = *(float *)(*local_480 + 4);
          local_4a0 = -local_49c / local_498;
          local_4a4 = 1.0 / local_498 + local_4a0;
          local_468 = local_480;
          local_458 = local_480;
          if (local_4a0 <= local_984) {
            if (local_984 <= local_4a4) {
              local_474[0] = local_984 * (local_984 * local_498 + local_49c);
            }
          }
          else {
            local_474[0] = 0.0;
          }
        }
        *local_698 = local_474[0];
        local_698 = local_698 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m512 _sum = _mm512_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = y * kernel_w + x;

                            __m512 _val = _mm512_load_ps(sptr);
                            __m512 _w = _mm512_load_ps(kptr + k * 16);
                            _sum = _mm512_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                sum += _mm512_comp_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}